

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O2

void __thiscall CVmObjFile::read_data_mode(CVmObjFile *this,vm_val_t *retval)

{
  CVmDataSource *fp;
  int iVar1;
  uint uVar2;
  vm_obj_id_t vVar3;
  char buf [32];
  
  fp = *(CVmDataSource **)((this->super_CVmObject).ext_ + 8);
  iVar1 = (*fp->_vptr_CVmDataSource[2])(fp,buf,1);
  if (iVar1 != 0) {
    retval->typ = VM_NIL;
    return;
  }
  if ((buf._0_4_ & 0xff) == 0x22) {
    iVar1 = CVmObjByteArray::read_from_data_file(retval,fp);
LAB_00275cd4:
    if (iVar1 != 0) {
LAB_00275cd8:
      CVmRun::throw_new_class(&G_interpreter_X,G_predef_X.file_io_exc,0,"file I/O error");
    }
  }
  else {
    if ((buf._0_4_ & 0xff) == 3) {
      iVar1 = (*fp->_vptr_CVmDataSource[2])(fp,buf,2);
      if (iVar1 == 0) {
        vVar3 = CVmObjString::create(0,(ulong)(ushort)buf._0_2_ - 2);
        iVar1 = (*fp->_vptr_CVmDataSource[2])
                          (fp,*(long *)((long)&G_obj_table_X.pages_[vVar3 >> 0xc][vVar3 & 0xfff].
                                               ptr_ + 8) + 2,(ulong)(ushort)buf._0_2_ - 2);
        if (iVar1 == 0) {
          retval->typ = VM_OBJ;
          (retval->val).obj = vVar3;
          return;
        }
      }
      goto LAB_00275cd8;
    }
    uVar2 = buf._0_4_ & 0xff;
    if (uVar2 == 8) {
      retval->typ = VM_TRUE;
      return;
    }
    if (uVar2 == 0x20) {
      iVar1 = (*fp->_vptr_CVmDataSource[2])(fp,buf,4);
      if (iVar1 != 0) goto LAB_00275cd8;
      retval->typ = VM_ENUM;
    }
    else {
      if (uVar2 == 0x21) {
        iVar1 = CVmObjBigNum::read_from_data_file(retval,fp);
        goto LAB_00275cd4;
      }
      if ((uVar2 != 1) || (iVar1 = (*fp->_vptr_CVmDataSource[2])(fp,buf,4), iVar1 != 0))
      goto LAB_00275cd8;
      retval->typ = VM_INT;
    }
    (retval->val).obj = buf._0_4_;
  }
  return;
}

Assistant:

void CVmObjFile::read_data_mode(VMG_ vm_val_t *retval)
{
    char buf[32];
    CVmObjString *str_obj;
    vm_obj_id_t str_id;
    CVmDataSource *fp = get_ext()->fp;

    /* read the type flag */
    if (fp->read(buf, 1))
    {
        /* end of file - return nil */
        retval->set_nil();
        return;
    }

    /* see what we have */
    switch(buf[0])
    {
    case VMOBJFILE_TAG_INT:
        /* read the INT4 value */
        if (fp->read(buf, 4))
            goto io_error;

        /* set the integer value from the buffer */
        retval->set_int(osrp4s(buf));
        break;

    case VMOBJFILE_TAG_ENUM:
        /* read the UINT4 value */
        if (fp->read(buf, 4))
            goto io_error;

        /* set the 'enum' value */
        retval->set_enum(t3rp4u(buf));
        break;

    case VMOBJFILE_TAG_STRING:
        /* 
         *   read the string's length - note that this length is two
         *   higher than the actual length of the string, because it
         *   includes the length prefix bytes 
         */
        if (fp->read(buf, 2))
            goto io_error;

        /* 
         *   allocate a new string of the required size (deducting two
         *   bytes from the indicated size, since the string allocator
         *   only wants to know about the bytes of the string we want to
         *   store, not the length prefix part) 
         */
        str_id = CVmObjString::create(vmg_ FALSE, osrp2(buf) - 2);
        str_obj = (CVmObjString *)vm_objp(vmg_ str_id);

        /* read the bytes of the string into the object's buffer */
        if (fp->read(str_obj->cons_get_buf(), osrp2(buf) - 2))
            goto io_error;

        /* success - set the string return value, and we're done */
        retval->set_obj(str_id);
        break;

    case VMOBJFILE_TAG_TRUE:
        /* it's a simple 'true' value */
        retval->set_true();
        break;

    case VMOBJFILE_TAG_BIGNUM:
        /* read the BigNumber value and return a new BigNumber object */
        if (CVmObjBigNum::read_from_data_file(vmg_ retval, fp))
            goto io_error;
        break;

    case VMOBJFILE_TAG_BYTEARRAY:
        /* read the ByteArray value and return a new ByteArray object */
        if (CVmObjByteArray::read_from_data_file(vmg_ retval, fp))
            goto io_error;
        break;

    default:
        /* invalid data - throw an error */
        G_interpreter->throw_new_class(vmg_ G_predef->file_io_exc,
                                       0, "file I/O error");
    }

    /* done */
    return;

io_error:
    /* 
     *   we'll come here if we read the type tag correctly but encounter
     *   an I/O error reading the value - this indicates a corrupted input
     *   stream, so throw an I/O error 
     */
    G_interpreter->throw_new_class(vmg_ G_predef->file_io_exc,
                                   0, "file I/O error");
}